

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

LONG PAL_ftell(PAL_FILE *f)

{
  long lVar1;
  long lVar2;
  
  if (PAL_InitializeChakraCoreCalled) {
    if (f == (PAL_FILE *)0x0) {
      fprintf(_stderr,"] %s %s:%d","PAL_ftell",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/file.cpp"
              ,0x2d9);
      fprintf(_stderr,"Expression: f != NULL\n");
    }
    lVar2 = ftell((FILE *)f->bsdFilePtr);
    if (PAL_InitializeChakraCoreCalled != false) {
      lVar1 = -1;
      if (lVar2 < 0x80000000) {
        lVar1 = lVar2;
      }
      return (LONG)lVar1;
    }
  }
  abort();
}

Assistant:

LONG
_cdecl
PAL_ftell(PAL_FILE * f)
{
    long lRetVal = 0;

    PERF_ENTRY(ftell);
    ENTRY( "ftell( %p )\n", f );

    _ASSERTE(f != NULL);
    lRetVal = ftell( f->bsdFilePtr );

#ifdef BIT64
    /* Windows does not set an error if the file pointer's position
    is greater than _I32_MAX. It just returns -1. */
    if (lRetVal > _I32_MAX)
    {
        lRetVal = -1;
    }
#endif

    LOGEXIT( "ftell returning %ld\n", lRetVal );
    PERF_EXIT(ftell);
    /* This explicit cast to LONG is used to silence any potential warnings
    due to implicitly casting the native long lRetVal to LONG when returning. */
    return (LONG)lRetVal;
}